

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::SourceCodeInfo_Location::MergeFrom
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *from)

{
  int *piVar1;
  int iVar2;
  LogMessage *other;
  string *psVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1ece);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  iVar2 = (from->path_).current_size_;
  if (iVar2 != 0) {
    RepeatedField<int>::Reserve(&this->path_,iVar2 + (this->path_).current_size_);
    memcpy((this->path_).elements_ + (this->path_).current_size_,(from->path_).elements_,
           (long)(from->path_).current_size_ << 2);
    piVar1 = &(this->path_).current_size_;
    *piVar1 = *piVar1 + (from->path_).current_size_;
  }
  iVar2 = (from->span_).current_size_;
  if (iVar2 != 0) {
    RepeatedField<int>::Reserve(&this->span_,iVar2 + (this->span_).current_size_);
    memcpy((this->span_).elements_ + (this->span_).current_size_,(from->span_).elements_,
           (long)(from->span_).current_size_ << 2);
    piVar1 = &(this->span_).current_size_;
    *piVar1 = *piVar1 + (from->span_).current_size_;
  }
  if ((from->_has_bits_[0] & 0x3fc) != 0) {
    if ((from->_has_bits_[0] & 4) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      if (this->leading_comments_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar3 = (string *)operator_new(0x20);
        (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
        psVar3->_M_string_length = 0;
        (psVar3->field_2)._M_local_buf[0] = '\0';
        this->leading_comments_ = psVar3;
      }
      std::__cxx11::string::_M_assign((string *)this->leading_comments_);
    }
    if ((from->_has_bits_[0] & 8) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 8;
      if (this->trailing_comments_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar3 = (string *)operator_new(0x20);
        (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
        psVar3->_M_string_length = 0;
        (psVar3->field_2)._M_local_buf[0] = '\0';
        this->trailing_comments_ = psVar3;
      }
      std::__cxx11::string::_M_assign((string *)this->trailing_comments_);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void SourceCodeInfo_Location::MergeFrom(const SourceCodeInfo_Location& from) {
  GOOGLE_CHECK_NE(&from, this);
  path_.MergeFrom(from.path_);
  span_.MergeFrom(from.span_);
  if (from._has_bits_[2 / 32] & (0xffu << (2 % 32))) {
    if (from.has_leading_comments()) {
      set_leading_comments(from.leading_comments());
    }
    if (from.has_trailing_comments()) {
      set_trailing_comments(from.trailing_comments());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}